

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int Ifn_ManStrCheck(char *pStr,int *pnInps,int *pnObjs)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  char *format;
  uint uVar5;
  byte *pbVar6;
  byte bVar7;
  int Marks [32];
  undefined4 auStack_20c [95];
  undefined8 uStack_90;
  int local_88 [32];
  
  local_88[0x1c] = 0;
  local_88[0x1d] = 0;
  local_88[0x1e] = 0;
  local_88[0x1f] = 0;
  local_88[0x18] = 0;
  local_88[0x19] = 0;
  local_88[0x1a] = 0;
  local_88[0x1b] = 0;
  local_88[0x14] = 0;
  local_88[0x15] = 0;
  local_88[0x16] = 0;
  local_88[0x17] = 0;
  local_88[0x10] = 0;
  local_88[0x11] = 0;
  local_88[0x12] = 0;
  local_88[0x13] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  uVar2 = 0xffffffff;
  iVar4 = 0;
  pbVar6 = (byte *)pStr;
  do {
    bVar1 = *pbVar6;
    if (bVar1 < 0x5b) {
      if ((bVar1 == 0x28) || (bVar1 == 0x3c)) {
LAB_0043ab82:
        iVar4 = iVar4 + 1;
      }
      else if (bVar1 == 0) {
        uVar5 = uVar2 + 1;
        if (-1 < (int)uVar2) {
          uVar3 = 0;
          do {
            if (local_88[uVar3] == 0) {
              uVar2 = (int)uVar3 + 0x61;
              format = "String \"%s\" has no symbol \'%c\'.\n";
LAB_0043ac1f:
              uStack_90 = 0x43ac26;
              Ifn_ErrorMessage(format,pStr,(ulong)uVar2);
              return 0;
            }
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
        *pnInps = uVar5;
        *pnObjs = iVar4 + uVar5;
        return 1;
      }
    }
    else if ((bVar1 == 0x5b) || (bVar1 == 0x7b)) goto LAB_0043ab82;
    if ((((0x35 < bVar1 - 0x28) || ((0x28000000580003U >> ((ulong)(bVar1 - 0x28) & 0x3f) & 1) == 0))
        && (bVar1 != 0x7b)) && ((bVar1 != 0x7d && (0x19 < (byte)(bVar1 + 0xbf))))) {
      bVar7 = bVar1 + 0x9f;
      if (0x19 < bVar7) {
        uVar2 = (uint)(char)bVar1;
        format = "String \"%s\" contains unrecognized symbol \'%c\'.\n";
        goto LAB_0043ac1f;
      }
      if ((int)uVar2 <= (int)(uint)bVar7) {
        uVar2 = (uint)bVar7;
      }
      auStack_20c[bVar1] = 1;
    }
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

int Ifn_ManStrCheck( char * pStr, int * pnInps, int * pnObjs )
{
    int i, nNodes = 0, Marks[32] = {0}, MaxVar = -1;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( Inf_ManOpenSymb(pStr+i) )
            nNodes++;
        if ( pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            MaxVar = Abc_MaxInt( MaxVar, (int)(pStr[i] - 'a') );
            Marks[pStr[i] - 'a'] = 1;
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    for ( i = 0; i <= MaxVar; i++ )
        if ( Marks[i] == 0 )
            return Ifn_ErrorMessage( "String \"%s\" has no symbol \'%c\'.\n", pStr, 'a' + i );
    *pnInps = MaxVar + 1;
    *pnObjs = MaxVar + 1 + nNodes;
    return 1;
}